

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadBehavior(MapData *map)

{
  FileReader *pFVar1;
  bool bVar2;
  int len;
  
  pFVar1 = map->MapLumps[0xb].Reader;
  if ((pFVar1 != (FileReader *)0x0) && ((int)pFVar1->Length != 0)) {
    map->file = pFVar1;
    len = 0;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    pFVar1 = map->MapLumps[0xb].Reader;
    if (pFVar1 != (FileReader *)0x0) {
      len = (int)pFVar1->Length;
    }
    FBehavior::StaticLoadModule(-1,map->file,len);
  }
  bVar2 = FBehavior::StaticCheckAllGood();
  if (bVar2) {
    return;
  }
  Printf("ACS scripts unloaded.\n");
  FBehavior::StaticUnloadModules();
  return;
}

Assistant:

void P_LoadBehavior(MapData * map)
{
	if (map->Size(ML_BEHAVIOR) > 0)
	{
		map->Seek(ML_BEHAVIOR);
		FBehavior::StaticLoadModule(-1, map->file, map->Size(ML_BEHAVIOR));
	}
	if (!FBehavior::StaticCheckAllGood())
	{
		Printf("ACS scripts unloaded.\n");
		FBehavior::StaticUnloadModules();
	}
}